

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void Centaurus::DFARoutineEM64T<char>::emit_state
               (X86Assembler *as,Label *rejectlabel,DFAState<char> *state,int index,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *labels,MyConstPool *pool)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *__x;
  pointer pNVar6;
  size_type sVar7;
  CharClass<char> *pCVar8;
  reference this;
  reference this_00;
  undefined4 in_stack_fffffffffffff9f8;
  uint32_t in_stack_fffffffffffff9fc;
  CodeEmitter *in_stack_fffffffffffffa00;
  undefined8 in_stack_fffffffffffffa08;
  uint32_t uVar9;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *this_01;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  int in_stack_fffffffffffffa1c;
  X86Assembler *in_stack_fffffffffffffa20;
  uint32_t in_stack_fffffffffffffa2c;
  CodeEmitter *in_stack_fffffffffffffa30;
  Range<char> *r_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  CharClass<char> *__range3;
  NFATransition<char> *tr_1;
  iterator __end0;
  iterator __begin0;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *__range2
  ;
  Range<char> *local_480;
  Range<char> *r;
  NFATransition<char> *tr;
  undefined4 local_468;
  undefined4 local_464;
  undefined4 local_45c;
  NFATransition<char> *local_458;
  const_iterator local_450;
  NFATransition<char> *local_448;
  Imm local_440;
  undefined8 local_430;
  undefined4 local_428;
  undefined4 local_424;
  undefined1 local_420 [8];
  Label looplabel;
  __normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
  local_3f0;
  __normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
  local_3e8;
  iterator i;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  transitions;
  MyConstPool *pool_local;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *labels_local;
  int index_local;
  DFAState<char> *state_local;
  Label *rejectlabel_local;
  X86Assembler *as_local;
  uint32_t signature;
  uint32_t signature_1;
  
  __x = NFABaseState<char,_Centaurus::IndexVector>::get_transitions
                  (&state->super_NFABaseState<char,_Centaurus::IndexVector>);
  std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
  vector((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *
         )&i,__x);
  local_3e8._M_current =
       (NFATransition<char> *)
       std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
       ::begin((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                *)&i);
  while( true ) {
    local_3f0._M_current =
         (NFATransition<char> *)
         std::
         vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
         end((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
              *)&i);
    bVar1 = __gnu_cxx::operator!=(&local_3e8,&local_3f0);
    uVar9 = (uint32_t)((ulong)in_stack_fffffffffffffa08 >> 0x20);
    if (!bVar1) break;
    pNVar6 = __gnu_cxx::
             __normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
             ::operator->(&local_3e8);
    iVar5 = NFATransition<char>::dest(pNVar6);
    if ((iVar5 == index) && (bVar1 = DFAState<char>::is_long(state), bVar1)) {
      looplabel.super_Operand.super_Operand_.field_0._mem.field_2 =
           (anon_union_8_2_78723da6_for_MemData_2)0x210000149;
      pNVar6 = __gnu_cxx::
               __normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
               ::operator->(&local_3e8);
      pCVar8 = NFATransition<char>::label(pNVar6);
      MyConstPool::load_charclass_filter<char>
                (pool,(X86Xmm *)((long)&looplabel.super_Operand.super_Operand_.field_0 + 8),pCVar8);
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(local_420);
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,local_420);
      local_430 = 0x32;
      local_424 = 6;
      local_428 = 0;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 (uint32_t)((ulong)in_stack_fffffffffffffa08 >> 0x20),
                 (Operand_ *)in_stack_fffffffffffffa00,
                 (Operand_ *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      asmjit::Imm::Imm(&local_440,0x14);
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 (uint32_t)((ulong)in_stack_fffffffffffffa08 >> 0x20),
                 (Operand_ *)in_stack_fffffffffffffa00,
                 (Operand_ *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                 (Operand_ *)0x169d86);
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 (uint32_t)((ulong)in_stack_fffffffffffffa08 >> 0x20),
                 (Operand_ *)in_stack_fffffffffffffa00,
                 (Operand_ *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c,
                 (Operand_ *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(Operand_ *)0x169e68);
      __gnu_cxx::
      __normal_iterator<Centaurus::NFATransition<char>const*,std::vector<Centaurus::NFATransition<char>,std::allocator<Centaurus::NFATransition<char>>>>
      ::__normal_iterator<Centaurus::NFATransition<char>*>
                ((__normal_iterator<Centaurus::NFATransition<char>const*,std::vector<Centaurus::NFATransition<char>,std::allocator<Centaurus::NFATransition<char>>>>
                  *)&local_450,&local_3e8);
      local_448 = (NFATransition<char> *)
                  std::
                  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                  ::erase((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                           *)&i,local_450);
      local_3e8._M_current = local_448;
    }
    else {
      local_458 = (NFATransition<char> *)
                  __gnu_cxx::
                  __normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                  ::operator++(&local_3e8,0);
    }
  }
  bVar1 = DFAState<char>::is_accept_state(state);
  if (bVar1) {
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),uVar9,
               (Operand_ *)in_stack_fffffffffffffa00,
               (Operand_ *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  }
  bVar1 = std::
          vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
          empty((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                 *)&i);
  if (bVar1) {
    asmjit::CodeEmitter::emit
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(Operand_ *)0x169fa8);
    local_45c = 1;
  }
  else {
    tr = (NFATransition<char> *)0x1000032;
    local_464 = 6;
    local_468 = 0;
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),uVar9,
               (Operand_ *)in_stack_fffffffffffffa00,
               (Operand_ *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),uVar9,
               (Operand_ *)in_stack_fffffffffffffa00,
               (Operand_ *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    asmjit::CodeEmitter::emit
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(Operand_ *)0x16a22f);
    sVar7 = std::
            vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
            ::size((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                    *)&i);
    if (sVar7 == 1) {
      r = (Range<char> *)
          std::
          vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
          operator[]((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                      *)&i,0);
      pCVar8 = NFATransition<char>::label((NFATransition<char> *)r);
      iVar5 = CharClass<char>::size(pCVar8);
      if (iVar5 == 1) {
        pCVar8 = NFATransition<char>::label((NFATransition<char> *)r);
        CharClass<char>::operator[]((CharClass<char> *)&__range2,(int)pCVar8);
        local_480 = (Range<char> *)&__range2;
        bVar2 = Range<char>::start(local_480);
        bVar3 = Range<char>::end(local_480);
        if (bVar2 + 1 == (uint)bVar3) {
          Range<char>::start(local_480);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c,
                     (Operand_ *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(Operand_ *)0x16a3d2);
        }
        else {
          Range<char>::start(local_480);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c,
                     (Operand_ *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
          Range<char>::end(local_480);
          Range<char>::start(local_480);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c,
                     (Operand_ *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(Operand_ *)0x16a555);
        }
        iVar5 = NFATransition<char>::dest((NFATransition<char> *)r);
        std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[](labels,(long)iVar5);
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(Operand_ *)0x16a5cd);
        local_45c = 1;
        Range<char>::~Range((Range<char> *)&__range2);
        goto LAB_0016aa89;
      }
    }
    __end0 = std::
             vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
             ::begin((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                      *)&i);
    tr_1 = (NFATransition<char> *)
           std::
           vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ::end((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                  *)&i);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                                       *)&tr_1), bVar1) {
      this = __gnu_cxx::
             __normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
             ::operator*(&__end0);
      pCVar8 = NFATransition<char>::label(this);
      __end0_1 = CharClass<char>::begin(pCVar8);
      r_1 = (Range<char> *)CharClass<char>::end(pCVar8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end0_1,
                                (__normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
                                 *)&r_1), bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
                  ::operator*(&__end0_1);
        bVar2 = Range<char>::start(this_00);
        bVar3 = Range<char>::end(this_00);
        if (bVar2 + 1 == (uint)bVar3) {
          Range<char>::start(this_00);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c,
                     (Operand_ *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
          iVar5 = NFATransition<char>::dest(this);
          std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[](labels,(long)iVar5)
          ;
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(Operand_ *)0x16a827);
        }
        else {
          in_stack_fffffffffffffa30 = (CodeEmitter *)as;
          Range<char>::start(this_00);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c,
                     (Operand_ *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
          in_stack_fffffffffffffa20 = as;
          cVar4 = Range<char>::end(this_00);
          in_stack_fffffffffffffa2c = CONCAT13(cVar4,(int3)in_stack_fffffffffffffa2c);
          cVar4 = Range<char>::start(this_00);
          in_stack_fffffffffffffa1c = CONCAT13(cVar4,(int3)in_stack_fffffffffffffa1c);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c,
                     (Operand_ *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
          in_stack_fffffffffffffa00 = (CodeEmitter *)as;
          this_01 = labels;
          iVar5 = NFATransition<char>::dest(this);
          std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                    (this_01,(long)iVar5);
          uVar9 = (uint32_t)((ulong)this_01 >> 0x20);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(Operand_ *)0x16a9c5);
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)CONCAT44(iVar5,in_stack_fffffffffffffa10),uVar9,
                     (Operand_ *)in_stack_fffffffffffffa00,
                     (Operand_ *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        }
        __gnu_cxx::
        __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
        ::operator++(&__end0_1);
      }
      __gnu_cxx::
      __normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
      ::operator++(&__end0);
    }
    asmjit::CodeEmitter::emit
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(Operand_ *)0x16aa7b);
    local_45c = 0;
  }
LAB_0016aa89:
  std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
  ~vector((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           *)&i);
  return;
}

Assistant:

void DFARoutineEM64T<TCHAR>::emit_state(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const DFAState<TCHAR>& state, int index, std::vector<asmjit::Label>& labels, MyConstPool& pool)
{
    std::vector<NFATransition<TCHAR> > transitions(state.get_transitions());

    for (auto i = transitions.begin(); i != transitions.end();)
    {
        if (i->dest() == index && state.is_long())
        {
            pool.load_charclass_filter(PATTERN2_REG, i->label());

            asmjit::Label looplabel = as.newLabel();

            as.bind(looplabel);

            as.movdqu(LOAD_REG, asmjit::X86Mem(INPUT_REG, 0));
            as.pcmpistri(PATTERN2_REG, LOAD_REG, asmjit::Imm(sizeof(TCHAR) == 1 ? 0x14 : 0x15));
            if (sizeof(TCHAR) == 2)
                as.sal(INDEX_REG, 1);
            as.add(INPUT_REG, INDEX_REG);
            as.cmp(INDEX_REG, 15);
            as.jg(looplabel);
            i = transitions.erase(i);
        }
        else
        {
            i++;
        }
    }

    if (state.is_accept_state())
        as.mov(BACKUP_REG, INPUT_REG);

    if (transitions.empty())
    {
        as.jmp(rejectlabel);
        return;
    }

    //Read the character from stream and advance the input position
    if (sizeof(TCHAR) == 1)
        as.movzx(CHAR_REG, asmjit::x86::byte_ptr(INPUT_REG, 0));
    else
        as.movzx(CHAR_REG, asmjit::x86::word_ptr(INPUT_REG, 0));
    as.mov(CHAR2_REG, CHAR_REG);
    if (sizeof(TCHAR) == 1)
        as.inc(INPUT_REG);
    else
        as.add(INPUT_REG, 2);

    if (transitions.size() == 1)
    {
        const NFATransition<TCHAR>& tr = transitions[0];

        if (tr.label().size() == 1)
        {
            const Range<TCHAR>& r = tr.label()[0];
            {
                if (r.start() + 1 == r.end())
                {
                    as.cmp(CHAR_REG, r.start());
                    as.jne(rejectlabel);
                }
                else
                {
                    as.sub(CHAR_REG, r.start());
                    as.cmp(CHAR_REG, r.end() - r.start());
                    as.jnb(rejectlabel);
                }
            }
            as.jmp(labels[tr.dest()]);

            return;
        }
    }
    for (const auto& tr : transitions)
    {
        for (const auto& r : tr.label())
        {
            if (r.start() + 1 == r.end())
            {
                //The range consists of one character: test for equality and jump
                as.cmp(CHAR_REG, r.start());
                as.je(labels[tr.dest()]);
            }
            else
            {
                //The range consists of multiple characters: range check and jump
                as.sub(CHAR_REG, r.start());
                as.cmp(CHAR_REG, r.end() - r.start());
                as.jb(labels[tr.dest()]);
                as.mov(CHAR_REG, CHAR2_REG);
            }
        }
    }
    //Jump to the "reject trampoline" and check if the input has ever been accepted
    as.jmp(rejectlabel);
}